

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.h
# Opt level: O3

void __thiscall
cmCacheManager::CacheIterator::CacheIterator(CacheIterator *this,cmCacheManager *cm,char *key)

{
  size_t sVar1;
  iterator iVar2;
  key_type local_40;
  
  this->Container = cm;
  (this->Position)._M_node = (_Base_ptr)0x0;
  if (key != (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(key);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,key,key + sVar1);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::find(&(this->Container->Cache)._M_t,&local_40);
    (this->Position)._M_node = iVar2._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

CacheIterator(cmCacheManager& cm, const char* key)
      : Container(cm)
    {
      if (key) {
        this->Find(key);
      }
    }